

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

bool Rml::CombineAndDecompose(Transform *t,Element *e)

{
  DecomposedMatrix4 p;
  bool bVar1;
  ThisType *other;
  PrimitiveList *this;
  reference p_00;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  TransformPrimitive local_14c;
  undefined1 local_104 [8];
  DecomposedMatrix4 decomposed;
  Matrix4f m_primitive;
  TransformPrimitive *primitive;
  iterator __end1;
  iterator __begin1;
  PrimitiveList *__range1;
  Matrix4f m;
  Element *e_local;
  Transform *t_local;
  
  m.vectors[3]._8_8_ = e;
  other = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity();
  Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Matrix4
            ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)&__range1,other);
  this = Transform::GetPrimitives(t);
  __end1 = ::std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::begin
                     (this);
  primitive = (TransformPrimitive *)
              ::std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::end
                        (this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::TransformPrimitive_*,_std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>_>
                                     *)&primitive), bVar1) {
    p_00 = __gnu_cxx::
           __normal_iterator<Rml::TransformPrimitive_*,_std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>_>
           ::operator*(&__end1);
    TransformUtilities::ResolveTransform
              ((Matrix4f *)&decomposed.skew.y,p_00,(Element *)m.vectors[3]._8_8_);
    Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*=
              ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)&__range1,
               (ThisType *)&decomposed.skew.y);
    __gnu_cxx::
    __normal_iterator<Rml::TransformPrimitive_*,_std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>_>
    ::operator++(&__end1);
  }
  Transforms::DecomposedMatrix4::DecomposedMatrix4((DecomposedMatrix4 *)local_104);
  bVar1 = TransformUtilities::Decompose((DecomposedMatrix4 *)local_104,(Matrix4f *)&__range1);
  if (bVar1) {
    Transform::ClearPrimitives(t);
    memcpy(&local_190,local_104,0x44);
    p.perspective.z = (float)(undefined4)uStack_188;
    p.perspective.w = (float)uStack_188._4_4_;
    p.perspective.x = (float)(undefined4)local_190;
    p.perspective.y = (float)local_190._4_4_;
    p.quaternion.x = (float)(undefined4)local_180;
    p.quaternion.y = (float)local_180._4_4_;
    p.quaternion.z = (float)(undefined4)uStack_178;
    p.quaternion.w = (float)uStack_178._4_4_;
    p.translation.x = (float)(undefined4)local_170;
    p.translation.y = (float)local_170._4_4_;
    p.translation.z = (float)(undefined4)uStack_168;
    p.scale.x = (float)uStack_168._4_4_;
    p.scale.y = (float)(undefined4)local_160;
    p.scale.z = (float)local_160._4_4_;
    p.skew.x = (float)(undefined4)uStack_158;
    p.skew.y = (float)uStack_158._4_4_;
    p.skew.z = local_150;
    TransformPrimitive::TransformPrimitive(&local_14c,p);
    Transform::AddPrimitive(t,&local_14c);
  }
  return bVar1;
}

Assistant:

static bool CombineAndDecompose(Transform& t, Element& e)
{
	Matrix4f m = Matrix4f::Identity();

	for (TransformPrimitive& primitive : t.GetPrimitives())
	{
		Matrix4f m_primitive = TransformUtilities::ResolveTransform(primitive, e);
		m *= m_primitive;
	}

	Transforms::DecomposedMatrix4 decomposed;

	if (!TransformUtilities::Decompose(decomposed, m))
		return false;

	t.ClearPrimitives();
	t.AddPrimitive(decomposed);

	return true;
}